

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loguru.cpp
# Opt level: O1

Text loguru::ec_to_text(EcHandle ec_handle)

{
  size_t sVar1;
  _func_int **pp_Var2;
  EcEntryBase *unaff_R15;
  Text parent_ec;
  char *local_20;
  
  get_error_context_for(unaff_R15);
  sVar1 = strlen(local_20);
  pp_Var2 = (_func_int **)malloc(sVar1 + 2);
  *(undefined1 *)pp_Var2 = 10;
  strcpy((char *)((long)pp_Var2 + 1),local_20);
  ec_handle->_vptr_EcEntryBase = pp_Var2;
  free(local_20);
  return (Text)(char *)ec_handle;
}

Assistant:

Text ec_to_text(EcHandle ec_handle)
	{
		Text parent_ec = get_error_context_for(ec_handle);
		char* with_newline = reinterpret_cast<char*>(malloc(strlen(parent_ec.c_str()) + 2));
		with_newline[0] = '\n';
		strcpy(with_newline + 1, parent_ec.c_str());
		return Text(with_newline);
	}